

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ostream *poVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  iterator iVar12;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  long lVar13;
  double *pdVar14;
  pointer puVar15;
  undefined1 auVar16 [16];
  double dVar17;
  initializer_list<double> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  vector<double,_std::allocator<double>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> originalIndices;
  vector<double,_std::allocator<double>_> elements;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  enumeratedElements;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  double local_100;
  double *local_f8;
  iterator iStack_f0;
  double *local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  double local_90;
  double *local_88;
  double *pdStack_80;
  long local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0x3ff0000000000000;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xbfb999999999999a;
  uStack_40 = 0xbfc999999999999a;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3ff3333333333333;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3ff199999999999a;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,__l,(allocator_type *)&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"elements=",9);
  printVector<double>(&local_c0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar10 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = NAN;
  uVar11 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar11 == 0) {
    local_100 = NAN;
  }
  else {
    local_88 = (double *)0x0;
    pdStack_80 = (double *)0x0;
    local_78 = 0;
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
      emplace_back<unsigned_long&,double_const&>
                ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                  *)&local_88,(unsigned_long *)&local_58,
                 local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
      pdVar4 = pdStack_80;
      pdVar7 = local_88;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_58.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
    } while (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3));
    if (local_88 != pdStack_80) {
      lVar13 = (long)pdStack_80 - (long)local_88;
      uVar6 = lVar13 >> 4;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::operator()(local_88,pdStack_80,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar13 < 0x101) {
        std::operator()(pdVar7,pdVar4);
      }
      else {
        pdVar14 = pdVar7 + 0x20;
        std::operator()(pdVar7,pdVar14);
        if (pdVar14 != pdVar4) {
          pdVar7 = pdVar7 + 0x21;
          do {
            dVar2 = *pdVar14;
            dVar1 = pdVar14[1];
            dVar17 = pdVar14[-1];
            pdVar9 = pdVar14;
            pdVar5 = pdVar7;
            if (dVar17 < dVar1) {
              do {
                pdVar9 = pdVar5;
                pdVar9[-1] = pdVar9[-3];
                *pdVar9 = dVar17;
                dVar17 = pdVar9[-4];
                pdVar5 = pdVar9 + -2;
              } while (dVar17 < dVar1);
              pdVar9 = pdVar9 + -3;
            }
            *pdVar9 = dVar2;
            pdVar9[1] = dVar1;
            pdVar14 = pdVar14 + 2;
            pdVar7 = pdVar7 + 2;
          } while (pdVar14 != pdVar4);
        }
      }
    }
    local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((ulong)(lVar10 >> 3) >> 1);
    if ((uVar11 & 8) == 0) {
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_d8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - 1);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_58;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_70,__l_00,(allocator_type *)&local_f8);
    }
    else {
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_d8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_70,__l_01,(allocator_type *)&local_f8);
    }
    local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_e8 = (double *)0x0;
    local_f8 = (double *)0x0;
    iStack_f0._M_current = (double *)0x0;
    local_100 = 0.0;
    if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar12._M_current = (double *)0x0;
    }
    else {
      puVar15 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)(local_88 + *puVar15 * 2));
        }
        else {
          *local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_88[*puVar15 * 2];
          local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (iStack_f0._M_current == local_e8) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_f8,iStack_f0,
                     local_88 + *puVar15 * 2 + 1);
        }
        else {
          *iStack_f0._M_current = local_88[*puVar15 * 2 + 1];
          iStack_f0._M_current = iStack_f0._M_current + 1;
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 !=
               local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
      iVar12._M_current = local_f8;
      if (local_f8 != iStack_f0._M_current) {
        local_100 = 0.0;
        pdVar7 = local_f8;
        do {
          local_100 = local_100 + *pdVar7;
          pdVar7 = pdVar7 + 1;
          iVar12._M_current = iStack_f0._M_current;
        } while (pdVar7 != iStack_f0._M_current);
      }
    }
    pdVar7 = local_f8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58,&local_d8);
    lVar10 = (long)iVar12._M_current - (long)pdVar7 >> 3;
    auVar16._8_4_ = (int)((long)iVar12._M_current - (long)pdVar7 >> 0x23);
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = 0x45300000;
    local_100 = local_100 /
                ((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90 = local_100;
    if (local_f8 != (double *)0x0) {
      operator_delete(local_f8,(long)local_e8 - (long)local_f8);
    }
    if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88 != (double *)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median_value=",0xd);
  poVar8 = std::ostream::_M_insert<double>(local_100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"indices=",8);
  printVector<unsigned_long>(&local_a8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    // Let's create an vector of floats to run our algorithm on.
    const std::vector<double> elements {
        1.2, 1.1, -0.1, -0.2, 0, 1
        };

    {
        // Print out the values.
        std::cout << "elements=";
        printVector(elements);
        std::cout << std::endl;
    }

    // At this point we declare what we want - constant value variables
    // "median_value" and indices. They are returned from the lambda and
    // unpacked by means of a structured binding into separate variables
    // right in the current scope.
    // Please notice that we do not capture "elements" into lambda's
    // capture list. A reference (&) capture list enables non-const access
    // to the outer-scope "elements". If for some reason "elements" are
    // declared non-const, lambda's body may by mistake modify its contents.
    // Instead we pass elements as a const reference parameter.
    const auto [median_value, indices] = [](const std::vector<double>& elements)
    {
        // Inside the lambda we allow ourselves some non-functional style by
        // initializing the result variable with a default value which is
        // a tuple of NaN and an empty list to account for possible
        // empty input list.
        auto result = std::make_tuple(
            std::numeric_limits<double>::quiet_NaN(),
            std::vector<size_t>());

        auto size = elements.size();

        if (size > 0)
        {
            // To keep track of the indices which were used to calculate
            // a median, we enumerate elements much alike in python.
            std::vector<std::pair<size_t, double> > enumeratedElements;
            for (size_t index = 0; index < elements.size(); ++index)
            {
                enumeratedElements.emplace_back(index, elements[index]);
            }

            // Now we are all set to sort the elements by values which
            // are stored in "second" field of a tuple.
            std::sort(enumeratedElements.begin(), enumeratedElements.end(),
                [](auto a, auto b){ return a.second > b.second; });

            // A median is calculated out of a middle element of odd-sized
            // lists and out of the two middle elements of an even-sized list.
            std::vector<size_t> indices = (size % 2 == 0) ?
                std::vector<size_t>{size / 2 - 1, size / 2} :
                std::vector<size_t>{size / 2};

            // Let's disentangle indices and values back from the tuples
            // that we are interested in.
            std::vector<size_t> originalIndices;
            std::vector<double> values;
            for (const auto& index : indices)
            {
                originalIndices.push_back(enumeratedElements[index].first);
                values.push_back(enumeratedElements[index].second);
            }

            // Here we stick to the functional paradigm again to mean-reduce
            // one or two values of interest.
            auto median = std::accumulate(values.begin(), values.end(), 0.0) /
                values.size();

            // And return a tuple to be unpacked with a structured binding.
            result = std::make_tuple(median, originalIndices);
        }
        return result;
    }(elements); // Our lambda is one-time use, so just call it.

    // ....... long code here .........

    // By mistake we try to reuse short variable names,
    // but therefore overwrite the original values

    // median_value = 12.3; // Does not compile
    // indices = std::vector<size_t>{100, 200}; // Does not compile

    // Voila! Our fancy const structured bindings save us from a bug,
    // and this happens at compile stage, not after a couple of hours
    // of debugging.

    // ....... more code here .........

    // At some point we again need the original "median_value" or "indices".
    // It is safe to assume that the values are never corrupted
    // thanks to the const qualifier.

    {
        // Print out the results.
        std::cout << "median_value=" << median_value << " ";
        std::cout << "indices=";
        printVector(indices);
        std::cout << std::endl;
    }

    return 0;
}